

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O2

void skiwi::compile_char_greater(asmcode *code,compiler_options *ops)

{
  skiwi *psVar1;
  uint64_t in_RDX;
  uint64_t lab;
  operand local_84 [3];
  string local_78;
  string error;
  string t;
  
  psVar1 = label;
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  error.field_2._M_local_buf[0] = '\0';
  label = label + 1;
  label_to_string_abi_cxx11_(&t,psVar1,in_RDX);
  psVar1 = label;
  if (ops->safe_primitives == true) {
    label = label + 1;
    label_to_string_abi_cxx11_(&local_78,psVar1,lab);
    std::__cxx11::string::operator=((string *)&error,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    local_78._M_dataplus._M_p._0_4_ = 5;
    local_84[0] = R11;
    local_84[1] = 0x39;
    local_84[2] = 2;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,(operation *)&local_78,local_84,local_84 + 1,(int *)(local_84 + 2));
    local_78._M_dataplus._M_p._0_4_ = 0x3d;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&local_78,&error);
    local_78._M_dataplus._M_p._0_4_ = 0x40;
    local_84[0] = R11;
    local_84[1] = 0xb;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
              (code,(operation *)&local_78,local_84,local_84 + 1);
    local_78._M_dataplus._M_p._0_4_ = 2;
    local_84[0] = R11;
    local_84[1] = 0x39;
    local_84[2] = 0xff;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,(operation *)&local_78,local_84,local_84 + 1,(int *)(local_84 + 2));
    local_78._M_dataplus._M_p._0_4_ = 5;
    local_84[0] = R11;
    local_84[1] = 0x39;
    local_84[2] = 0x17;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,(operation *)&local_78,local_84,local_84 + 1,(int *)(local_84 + 2));
    local_78._M_dataplus._M_p._0_4_ = 0x3d;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&local_78,&error);
    local_78._M_dataplus._M_p._0_4_ = 0x40;
    local_84[0] = R11;
    local_84[1] = 0xc;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
              (code,(operation *)&local_78,local_84,local_84 + 1);
    local_78._M_dataplus._M_p._0_4_ = 2;
    local_84[0] = R11;
    local_84[1] = 0x39;
    local_84[2] = 0xff;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,(operation *)&local_78,local_84,local_84 + 1,(int *)(local_84 + 2));
    local_78._M_dataplus._M_p._0_4_ = 5;
    local_84[0] = R11;
    local_84[1] = 0x39;
    local_84[2] = 0x17;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,(operation *)&local_78,local_84,local_84 + 1,(int *)(local_84 + 2));
    local_78._M_dataplus._M_p._0_4_ = 0x3d;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&local_78,&error);
  }
  local_78._M_dataplus._M_p._0_4_ = 5;
  local_84[0] = RCX;
  local_84[1] = 0xc;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_78,local_84,local_84 + 1);
  local_78._M_dataplus._M_p._0_4_ = 0x3b;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_78,&t);
  local_78._M_dataplus._M_p._0_4_ = 0x40;
  local_84[0] = RAX;
  local_84[1] = 0x39;
  local_84[2] = 7;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_78,local_84,local_84 + 1,(int *)(local_84 + 2));
  local_78._M_dataplus._M_p._0_4_ = 0x2c;
  local_84[0] = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_78,local_84);
  local_78._M_dataplus._M_p._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_78,&t);
  local_78._M_dataplus._M_p._0_4_ = 0x40;
  local_84[0] = RAX;
  local_84[1] = 0x39;
  local_84[2] = 0xf;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_78,local_84,local_84 + 1,(int *)(local_84 + 2));
  local_78._M_dataplus._M_p._0_4_ = 0x2c;
  local_84[0] = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_78,local_84);
  if (ops->safe_primitives == true) {
    error_label(code,&error,re_char_greater_contract_violation);
  }
  std::__cxx11::string::~string((string *)&t);
  std::__cxx11::string::~string((string *)&error);
  return;
}

Assistant:

void compile_char_greater(asmcode& code, const compiler_options& ops)
  {
  std::string error;
  std::string t = label_to_string(label++);
  if (ops.safe_primitives)
    {
    error = label_to_string(label++);
    code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 2);
    code.add(asmcode::JNES, error);
    code.add(asmcode::MOV, asmcode::R11, asmcode::RCX);
    code.add(asmcode::AND, asmcode::R11, asmcode::NUMBER, char_mask);
    code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, char_tag);
    code.add(asmcode::JNES, error);
    code.add(asmcode::MOV, asmcode::R11, asmcode::RDX);
    code.add(asmcode::AND, asmcode::R11, asmcode::NUMBER, char_mask);
    code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, char_tag);
    code.add(asmcode::JNES, error);
    }
  code.add(asmcode::CMP, asmcode::RCX, asmcode::RDX);
  code.add(asmcode::JGS, t);
  code.add(asmcode::MOV, asmcode::RAX, asmcode::NUMBER, bool_f);
  code.add(asmcode::JMP, CONTINUE);
  code.add(asmcode::LABEL, t);
  code.add(asmcode::MOV, asmcode::RAX, asmcode::NUMBER, bool_t);
  code.add(asmcode::JMP, CONTINUE);
  if (ops.safe_primitives)
    {
    error_label(code, error, re_char_greater_contract_violation);
    }
  }